

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::BeginPopupModal(char *name,bool *p_open,ImGuiWindowFlags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  ImGuiContext *pIVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  ImGuiID id;
  ImGuiViewport *pIVar9;
  
  pIVar6 = GImGui;
  id = ImGuiWindow::GetID(GImGui->CurrentWindow,name,(char *)0x0);
  bVar8 = IsPopupOpen(id,0);
  if (bVar8) {
    if (((pIVar6->NextWindowData).Flags & 1) == 0) {
      pIVar9 = GetMainViewport();
      pIVar7 = GImGui;
      fVar1 = (pIVar9->Size).x;
      fVar2 = (pIVar9->Pos).x;
      fVar3 = (pIVar9->Size).y;
      fVar4 = (pIVar9->Pos).y;
      (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 1;
      IVar5.y = fVar3 * 0.5 + fVar4;
      IVar5.x = fVar1 * 0.5 + fVar2;
      (pIVar7->NextWindowData).PosVal = IVar5;
      (pIVar7->NextWindowData).PosPivotVal.x = 0.5;
      (pIVar7->NextWindowData).PosPivotVal.y = 0.5;
      (pIVar7->NextWindowData).PosCond = 4;
    }
    bVar8 = Begin(name,p_open,flags | 0xc000020);
    if (bVar8) {
      if (p_open == (bool *)0x0) {
        return true;
      }
      if (*p_open != false) {
        return true;
      }
      EndPopup();
      if (bVar8) {
        ClosePopupToLevel((pIVar6->BeginPopupStack).Size,true);
      }
    }
    else {
      EndPopup();
    }
  }
  else {
    (pIVar6->NextWindowData).Flags = 0;
  }
  return false;
}

Assistant:

bool ImGui::BeginPopupModal(const char* name, bool* p_open, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(name);
    if (!IsPopupOpen(id, ImGuiPopupFlags_None))
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        return false;
    }

    // Center modal windows by default for increased visibility
    // (this won't really last as settings will kick in, and is mostly for backward compatibility. user may do the same themselves)
    // FIXME: Should test for (PosCond & window->SetWindowPosAllowFlags) with the upcoming window.
    if ((g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasPos) == 0)
    {
        const ImGuiViewport* viewport = GetMainViewport();
        SetNextWindowPos(viewport->GetCenter(), ImGuiCond_FirstUseEver, ImVec2(0.5f, 0.5f));
    }

    flags |= ImGuiWindowFlags_Popup | ImGuiWindowFlags_Modal | ImGuiWindowFlags_NoCollapse;
    const bool is_open = Begin(name, p_open, flags);
    if (!is_open || (p_open && !*p_open)) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    {
        EndPopup();
        if (is_open)
            ClosePopupToLevel(g.BeginPopupStack.Size, true);
        return false;
    }
    return is_open;
}